

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::MultiDrawIndexed
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,MultiDrawIndexedAttribs *Attribs,
          int param_2)

{
  String *__return_storage_ptr__;
  PRIMITIVE_TOPOLOGY Topology_00;
  DRAW_FLAGS DVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  Uint32 UVar4;
  Char *pCVar5;
  PipelineStateGLImpl *pPVar6;
  PipelineStateDesc *pPVar7;
  GraphicsPipelineDesc *pGVar8;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  uint local_138;
  Uint32 i;
  PRIMITIVE_TOPOLOGY Topology;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  MultiDrawIndexedAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  DVar1 = Diligent::operator&(Attribs->Flags,DRAW_FLAG_VERIFY_DRAW_ATTRIBS);
  if (DVar1 != DRAW_FLAG_NONE) {
    if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
      bVar2 = IsDeferred(this);
      if (!bVar2) {
        FormatString<char[79]>
                  ((string *)local_40,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"MultiDrawIndexed",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x992);
        std::__cxx11::string::~string((string *)local_40);
      }
      FormatString<char[97]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x992);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
    if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
      __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
      GetCommandQueueTypeString_abi_cxx11_
                (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                ((string *)local_90,(Diligent *)"MultiDrawIndexed",(char (*) [17])0xf4cb59,
                 (char (*) [22])__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x992);
      std::__cxx11::string::~string((string *)local_90);
    }
    bVar2 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator!(&this->m_pPipelineState);
    if (bVar2) {
      FormatString<char[76]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [76])
                 "MultiDrawIndexed command arguments are invalid: no pipeline state is bound.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x994);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->(&this->m_pPipelineState);
    pPVar7 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetDesc
                       (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if (pPVar7->PipelineType != PIPELINE_TYPE_GRAPHICS) {
      pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->(&this->m_pPipelineState);
      pPVar7 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetDesc
                         (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      FormatString<char[65],char_const*,char[30]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (Diligent *)"MultiDrawIndexed command arguments are invalid: pipeline state \'",
                 (char (*) [65])pPVar7,(char **)"\' is not a graphics pipeline.",
                 (char (*) [30])in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x998);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    bVar2 = RefCntAutoPtr<Diligent::BufferGLImpl>::operator!(&this->m_pIndexBuffer);
    if (bVar2) {
      FormatString<char[74]>
                ((string *)((long)&msg_6.field_2 + 8),
                 (char (*) [74])
                 "MultiDrawIndexed command arguments are invalid: no index buffer is bound.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x99a);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    bVar2 = VerifyMultiDrawIndexedAttribs(Attribs);
    if (!bVar2) {
      FormatString<char[36]>((string *)&i,(char (*) [36])"MultiDrawIndexedAttribs are invalid");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x99c);
      std::__cxx11::string::~string((string *)&i);
    }
  }
  bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&this->m_pPipelineState);
  if (bVar2) {
    pPVar6 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->(&this->m_pPipelineState);
    pGVar8 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                       (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    Topology_00 = pGVar8->PrimitiveTopology;
    for (local_138 = 0; local_138 < Attribs->DrawCount; local_138 = local_138 + 1) {
      UVar4 = GetPrimitiveCount(Topology_00,Attribs->pDrawItems[local_138].NumIndices);
      (this->m_Stats).PrimitiveCounts[Topology_00] =
           UVar4 + (this->m_Stats).PrimitiveCounts[Topology_00];
    }
  }
  if ((this->m_NativeMultiDrawSupported & 1U) == 0) {
    (this->m_Stats).CommandCounters.DrawIndexed =
         Attribs->DrawCount + (this->m_Stats).CommandCounters.DrawIndexed;
  }
  else {
    (this->m_Stats).CommandCounters.MultiDrawIndexed =
         (this->m_Stats).CommandCounters.MultiDrawIndexed + 1;
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::MultiDrawIndexed(const MultiDrawIndexedAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "MultiDrawIndexed");

        DEV_CHECK_ERR(m_pPipelineState, "MultiDrawIndexed command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_GRAPHICS,
                      "MultiDrawIndexed command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a graphics pipeline.");

        DEV_CHECK_ERR(m_pIndexBuffer, "MultiDrawIndexed command arguments are invalid: no index buffer is bound.");

        DEV_CHECK_ERR(VerifyMultiDrawIndexedAttribs(Attribs), "MultiDrawIndexedAttribs are invalid");
    }
#endif
    if (m_pPipelineState)
    {
        const PRIMITIVE_TOPOLOGY Topology = m_pPipelineState->GetGraphicsPipelineDesc().PrimitiveTopology;
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
            m_Stats.PrimitiveCounts[Topology] += GetPrimitiveCount(Topology, Attribs.pDrawItems[i].NumIndices);
    }
    if (m_NativeMultiDrawSupported)
        ++m_Stats.CommandCounters.MultiDrawIndexed;
    else
        m_Stats.CommandCounters.DrawIndexed += Attribs.DrawCount;
}